

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O2

uchar * cd_alloc(zip_conflict *zip,size_t length)

{
  cd_segment *pcVar1;
  cd_segment *__ptr;
  uchar *puVar2;
  cd_segment **ppcVar3;
  cd_segment *pcVar4;
  
  pcVar1 = zip->central_directory;
  if (pcVar1 == (cd_segment *)0x0) {
LAB_00194bcf:
    __ptr = (cd_segment *)calloc(1,0x20);
    if (__ptr != (cd_segment *)0x0) {
      __ptr->buff_size = 0x10000;
      puVar2 = (uchar *)malloc(0x10000);
      __ptr->buff = puVar2;
      if (puVar2 != (uchar *)0x0) {
        pcVar4 = (cd_segment *)&zip->central_directory_last;
        __ptr->p = puVar2;
        if (pcVar1 == (cd_segment *)0x0) {
          ppcVar3 = &zip->central_directory;
        }
        else {
          ppcVar3 = (cd_segment **)pcVar4;
          pcVar4 = *(cd_segment **)pcVar4;
        }
        pcVar4->next = __ptr;
        *ppcVar3 = __ptr;
        goto LAB_00194c28;
      }
      free(__ptr);
    }
    puVar2 = (uchar *)0x0;
  }
  else {
    __ptr = zip->central_directory_last;
    puVar2 = __ptr->p;
    if (__ptr->buff + __ptr->buff_size < puVar2 + length) goto LAB_00194bcf;
LAB_00194c28:
    __ptr->p = puVar2 + length;
    zip->central_directory_bytes = zip->central_directory_bytes + length;
  }
  return puVar2;
}

Assistant:

static unsigned char *
cd_alloc(struct zip *zip, size_t length)
{
	unsigned char *p;

	if (zip->central_directory == NULL
	    || (zip->central_directory_last->p + length
		> zip->central_directory_last->buff + zip->central_directory_last->buff_size)) {
		struct cd_segment *segment = calloc(1, sizeof(*segment));
		if (segment == NULL)
			return NULL;
		segment->buff_size = 64 * 1024;
		segment->buff = malloc(segment->buff_size);
		if (segment->buff == NULL) {
			free(segment);
			return NULL;
		}
		segment->p = segment->buff;

		if (zip->central_directory == NULL) {
			zip->central_directory
			    = zip->central_directory_last
			    = segment;
		} else {
			zip->central_directory_last->next = segment;
			zip->central_directory_last = segment;
		}
	}

	p = zip->central_directory_last->p;
	zip->central_directory_last->p += length;
	zip->central_directory_bytes += length;
	return (p);
}